

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain
          (InterfaceVariableScalarReplacement *this,Instruction *access_chain,
          Instruction *base_access_chain)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_iterator __cbeg;
  Operand *pOVar4;
  pointer pOVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  OperandList new_operands;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  
  if ((base_access_chain->opcode_ == OpAccessChain) && (access_chain->opcode_ == OpAccessChain)) {
    uVar2 = (access_chain->has_result_id_ & 1) + 1;
    if (access_chain->has_type_id_ == false) {
      uVar2 = (uint)access_chain->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(access_chain,uVar2);
    uVar3 = 0;
    if (base_access_chain->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand
                        (base_access_chain,(uint)base_access_chain->has_type_id_);
    }
    if (uVar2 == uVar3) {
      local_38.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar7 = (base_access_chain->has_result_id_ & 1) + 1;
      if (base_access_chain->has_type_id_ == false) {
        uVar7 = (uint)base_access_chain->has_result_id_;
      }
      if (uVar7 != (int)((ulong)((long)(base_access_chain->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(base_access_chain->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
         ) {
        uVar2 = 0;
        do {
          pOVar4 = Instruction::GetInOperand(base_access_chain,uVar2);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          emplace_back<spvtools::opt::Operand&>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_38,pOVar4);
          uVar2 = uVar2 + 1;
          uVar7 = (base_access_chain->has_result_id_ & 1) + 1;
          if (base_access_chain->has_type_id_ == false) {
            uVar7 = (uint)base_access_chain->has_result_id_;
          }
        } while (uVar2 < (int)((ulong)((long)(base_access_chain->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(base_access_chain->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar7);
      }
      pOVar5 = (access_chain->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(access_chain->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5;
      cVar6 = access_chain->has_type_id_;
      bVar1 = access_chain->has_result_id_;
      uVar7 = (bVar1 & 1) + 1;
      if ((bool)cVar6 == false) {
        uVar7 = (uint)bVar1;
      }
      if (1 < (int)(uVar8 >> 4) * -0x55555555 - uVar7) {
        uVar2 = 1;
        do {
          pOVar4 = Instruction::GetInOperand(access_chain,uVar2);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          emplace_back<spvtools::opt::Operand&>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_38,pOVar4);
          uVar2 = uVar2 + 1;
          pOVar5 = (access_chain->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = (long)(access_chain->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5;
          cVar6 = access_chain->has_type_id_;
          bVar1 = access_chain->has_result_id_;
          uVar7 = (bVar1 & 1) + 1;
          if ((bool)cVar6 == false) {
            uVar7 = (uint)bVar1;
          }
        } while (uVar2 < (int)(uVar8 >> 4) * -0x55555555 - uVar7);
      }
      uVar7 = (bVar1 & 1) + 1;
      if (cVar6 == '\0') {
        uVar7 = (uint)bVar1;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&access_chain->operands_,
                 (Operand *)
                 ((long)((pOVar5->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar7 * 0x30)),
                 (Operand *)((long)((pOVar5->words).buffer + 0xfffffffffffffffa) + uVar8));
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &access_chain->operands_,
                 (access_chain->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_38.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_38.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_38);
      return;
    }
  }
  __assert_fail("base_access_chain->opcode() == spv::Op::OpAccessChain && access_chain->opcode() == spv::Op::OpAccessChain && access_chain->GetSingleWordInOperand(0) == base_access_chain->result_id()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x1c3,
                "void spvtools::opt::InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain(Instruction *, Instruction *)"
               );
}

Assistant:

void InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain(
    Instruction* access_chain, Instruction* base_access_chain) {
  assert(base_access_chain->opcode() == spv::Op::OpAccessChain &&
         access_chain->opcode() == spv::Op::OpAccessChain &&
         access_chain->GetSingleWordInOperand(0) ==
             base_access_chain->result_id());
  Instruction::OperandList new_operands;
  for (uint32_t i = 0; i < base_access_chain->NumInOperands(); ++i) {
    new_operands.emplace_back(base_access_chain->GetInOperand(i));
  }
  for (uint32_t i = 1; i < access_chain->NumInOperands(); ++i) {
    new_operands.emplace_back(access_chain->GetInOperand(i));
  }
  access_chain->SetInOperands(std::move(new_operands));
}